

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

void assert_run_work(uv_loop_t *loop)

{
  uint uVar1;
  int iVar2;
  undefined1 local_90 [4];
  int r;
  uv_work_t work_req;
  uv_loop_t *loop_local;
  
  work_req.work_req.wq[1] = loop;
  if (work_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x271,"work_cb_count == 0");
    abort();
  }
  if (after_work_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x272,"after_work_cb_count == 0");
    abort();
  }
  uVar1 = getpid();
  printf("Queue in %d\n",(ulong)uVar1);
  iVar2 = uv_queue_work((uv_loop_t *)work_req.work_req.wq[1],(uv_work_t *)local_90,work_cb,
                        after_work_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x275,"r == 0");
    abort();
  }
  getpid();
  printf("Running in %d\n");
  uv_run((uv_loop_t *)work_req.work_req.wq[1],UV_RUN_DEFAULT);
  if (work_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x279,"work_cb_count == 1");
    abort();
  }
  if (after_work_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x27a,"after_work_cb_count == 1");
    abort();
  }
  work_cb_count = 0;
  after_work_cb_count = 0;
  return;
}

Assistant:

static void assert_run_work(uv_loop_t* const loop) {
  uv_work_t work_req;
  int r;

  ASSERT(work_cb_count == 0);
  ASSERT(after_work_cb_count == 0);
  printf("Queue in %d\n", getpid());
  r = uv_queue_work(loop, &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  printf("Running in %d\n", getpid());
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  /* cleanup  */
  work_cb_count = 0;
  after_work_cb_count = 0;
}